

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

QString * __thiscall
MakefileGenerator::buildArgs(QString *__return_storage_ptr__,MakefileGenerator *this,bool withExtra)

{
  char *this_00;
  long lVar1;
  QString *arg;
  QString *pQVar2;
  long in_FS_OFFSET;
  QString local_78;
  _func_int **local_58;
  QArrayData *local_50;
  SourceFiles *pSStack_48;
  qsizetype local_40;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar1 = (Option::globals->qmake_args).d.size;
  if (lVar1 != 0) {
    pQVar2 = (Option::globals->qmake_args).d.ptr;
    lVar1 = lVar1 * 0x18;
    do {
      shellQuote(&local_78,this,pQVar2);
      local_40 = local_78.d.size;
      pSStack_48 = (SourceFiles *)local_78.d.ptr;
      local_50 = &(local_78.d.d)->super_QArrayData;
      local_58 = (_func_int **)0x2b1f52;
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (char16_t *)0x0;
      local_78.d.size = 0;
      this = (MakefileGenerator *)&stack0xffffffffffffffa8;
      ::operator+=(__return_storage_ptr__,
                   (QStringBuilder<const_char_(&)[2],_QString> *)&stack0xffffffffffffffa8);
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          this = (MakefileGenerator *)0x2;
          QArrayData::deallocate(local_50,2,0x10);
        }
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          this = (MakefileGenerator *)0x2;
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar2 = pQVar2 + 1;
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != 0);
  }
  if ((withExtra) && ((Option::globals->qmake_extra_args).d.size != 0)) {
    this_00 = " --";
    QString::append(__return_storage_ptr__," --",3);
    lVar1 = (Option::globals->qmake_extra_args).d.size;
    if (lVar1 != 0) {
      pQVar2 = (Option::globals->qmake_extra_args).d.ptr;
      lVar1 = lVar1 * 0x18;
      do {
        shellQuote(&local_78,(MakefileGenerator *)this_00,pQVar2);
        local_40 = local_78.d.size;
        pSStack_48 = (SourceFiles *)local_78.d.ptr;
        local_50 = &(local_78.d.d)->super_QArrayData;
        local_58 = (_func_int **)0x2b1f52;
        local_78.d.d = (Data *)0x0;
        local_78.d.ptr = (char16_t *)0x0;
        local_78.d.size = 0;
        this_00 = (char *)&stack0xffffffffffffffa8;
        ::operator+=(__return_storage_ptr__,
                     (QStringBuilder<const_char_(&)[2],_QString> *)&stack0xffffffffffffffa8);
        if (local_50 != (QArrayData *)0x0) {
          LOCK();
          (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            this_00 = (char *)0x2;
            QArrayData::deallocate(local_50,2,0x10);
          }
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            this_00 = (char *)0x2;
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar2 = pQVar2 + 1;
        lVar1 = lVar1 + -0x18;
      } while (lVar1 != 0);
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString MakefileGenerator::buildArgs(bool withExtra)
{
    QString ret;

    for (const QString &arg : std::as_const(Option::globals->qmake_args))
        ret += " " + shellQuote(arg);
    if (withExtra && !Option::globals->qmake_extra_args.isEmpty()) {
        ret += " --";
        for (const QString &arg : std::as_const(Option::globals->qmake_extra_args))
            ret += " " + shellQuote(arg);
    }
    return ret;
}